

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

void bgr_888_to_xbgr_8888
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  uint *puVar1;
  uint3 *puVar2;
  uint *puVar3;
  int iVar4;
  
  puVar2 = (uint3 *)((long)src + (long)(sy * src_pitch) + (long)(sx * 3));
  puVar3 = (uint *)((long)dst + (long)dx * 4 + (long)(dy * dst_pitch));
  iVar4 = 0;
  if (height < 1) {
    height = 0;
  }
  for (; iVar4 != height; iVar4 = iVar4 + 1) {
    puVar1 = puVar3 + width;
    for (; puVar3 < puVar1; puVar3 = puVar3 + 1) {
      *puVar3 = (uint)*puVar2;
      puVar2 = (uint3 *)((long)puVar2 + 3);
    }
    puVar2 = (uint3 *)((long)puVar2 + (long)(width * -3 + src_pitch));
    puVar3 = puVar3 + ((long)(dst_pitch / 4) - (long)width);
  }
  return;
}

Assistant:

static void bgr_888_to_xbgr_8888(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint8_t *src_ptr = (const uint8_t *)((const char *)src + sy * src_pitch);
   uint32_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 1 - width * 3;
   int dst_gap = dst_pitch / 4 - width;
   src_ptr += sx * 3;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint32_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         #ifdef ALLEGRO_BIG_ENDIAN
         int src_pixel = src_ptr[2] | (src_ptr[1] << 8) | (src_ptr[0] << 16);
         #else
         int src_pixel = src_ptr[0] | (src_ptr[1] << 8) | (src_ptr[2] << 16);
         #endif
         *dst_ptr = ALLEGRO_CONVERT_BGR_888_TO_XBGR_8888(src_pixel);
         src_ptr += 1 * 3;
         dst_ptr += 1;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}